

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O2

void __thiscall
duckdb::PatasGroupState<unsigned_long>::LoadValues<false>
          (PatasGroupState<unsigned_long> *this,unsigned_long *value_buffer,idx_t count)

{
  unsigned_long uVar1;
  uint8_t *puVar2;
  bool bVar3;
  
  *value_buffer = 0;
  puVar2 = &this->unpacked_data[0].index_diff;
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    uVar1 = patas::PatasDecompression<unsigned_long>::DecompressValue
                      (&this->byte_reader,
                       ((PatasUnpackedValueStats *)(puVar2 + -2))->significant_bytes,puVar2[-1],
                       value_buffer[-(ulong)*puVar2]);
    *value_buffer = uVar1;
    puVar2 = puVar2 + 3;
    value_buffer = value_buffer + 1;
  }
  return;
}

Assistant:

void LoadValues(EXACT_TYPE *value_buffer, idx_t count) {
		if (SKIP) {
			return;
		}
		value_buffer[0] = (EXACT_TYPE)0;
		for (idx_t i = 0; i < count; i++) {
			value_buffer[i] = patas::PatasDecompression<EXACT_TYPE>::DecompressValue(
			    byte_reader, unpacked_data[i].significant_bytes, unpacked_data[i].trailing_zeros,
			    value_buffer[i - unpacked_data[i].index_diff]);
		}
	}